

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplesort.hpp
# Opt level: O2

vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> * __thiscall
mxx::impl::
sample_block_decomp<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,std::less<TwoBSA<unsigned_int>>>
          (vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
           *__return_storage_ptr__,impl *this,impl *begin,int param_4,long param_5,
          undefined8 param_6)

{
  impl *piVar1;
  int iVar2;
  pointer pTVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  size_type sVar7;
  long lVar8;
  pointer pTVar9;
  ulong uVar10;
  size_type __new_size;
  undefined8 uVar11;
  allocator_type local_65;
  int local_64;
  undefined8 local_60;
  vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_> all_samples;
  
  uVar5 = ((long)begin - (long)this) / 0xc;
  local_60 = param_6;
  if (begin == this) {
    assert_fail("local_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/samplesort.hpp"
                ,0xa9,"sample_block_decomp");
  }
  iVar2 = *(int *)(param_5 + 0x10);
  sVar7 = (size_type)param_4;
  local_64 = param_4;
  std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::vector
            (__return_storage_ptr__,sVar7,(allocator_type *)&all_samples);
  uVar11 = local_60;
  iVar4 = local_64;
  lVar8 = 0;
  for (uVar10 = 0;
      pTVar9 = (__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start,
      uVar10 < (ulong)(((long)(__return_storage_ptr__->
                              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9) / 0xc);
      uVar10 = uVar10 + 1) {
    lVar6 = (uVar5 / (ulong)(long)(param_4 + 1) +
            (ulong)(uVar10 < uVar5 % (ulong)(long)(param_4 + 1))) * 0xc;
    *(undefined4 *)((long)&pTVar9->SA + lVar8) = *(undefined4 *)(this + lVar6 + -4);
    piVar1 = this + lVar6 + -0xc;
    this = this + lVar6;
    *(undefined8 *)((long)&pTVar9->B1 + lVar8) = *(undefined8 *)piVar1;
    lVar8 = lVar8 + 0xc;
  }
  if (*(int *)(param_5 + 0x14) == 0) {
    std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::vector
              (&all_samples,(long)(iVar2 * local_64),&local_65);
    uVar11 = local_60;
    MPI_Gather((__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start,iVar4,local_60,
               all_samples.
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,iVar4,local_60,0,
               *(undefined8 *)(param_5 + 8));
    std::
    __sort<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<TwoBSA<unsigned_int>>>>
              (all_samples.
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               all_samples.
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    __new_size = (long)iVar2 - 1;
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0xc != __new_size) {
      std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::resize
                (__return_storage_ptr__,__new_size);
    }
    pTVar9 = all_samples.
             super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>.
             _M_impl.super__Vector_impl_data._M_start + (sVar7 - 1);
    lVar8 = 0;
    for (uVar5 = 0;
        pTVar3 = (__return_storage_ptr__->
                 super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_start,
        uVar5 < (ulong)(((long)(__return_storage_ptr__->
                               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar3) / 0xc);
        uVar5 = uVar5 + 1) {
      *(uint *)((long)&pTVar3->SA + lVar8) = pTVar9->SA;
      *(undefined8 *)((long)&pTVar3->B1 + lVar8) = *(undefined8 *)pTVar9;
      pTVar9 = pTVar9 + sVar7;
      lVar8 = lVar8 + 0xc;
    }
    std::_Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::~_Vector_base
              (&all_samples.
                super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>);
  }
  else {
    MPI_Gather(pTVar9,local_64,local_60,0,0,local_60,0,*(undefined8 *)(param_5 + 8));
    sVar7 = (long)iVar2 - 1;
    if (((long)(__return_storage_ptr__->
               super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
               _M_impl.super__Vector_impl_data._M_finish -
        (long)(__return_storage_ptr__->
              super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>).
              _M_impl.super__Vector_impl_data._M_start) / 0xc != sVar7) {
      std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>::resize
                (__return_storage_ptr__,sVar7);
    }
  }
  pTVar9 = (__return_storage_ptr__->
           super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>)._M_impl
           .super__Vector_impl_data._M_start;
  MPI_Bcast(pTVar9,((long)(__return_storage_ptr__->
                          super__Vector_base<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar9) / 0xc &
                   0xffffffff,uVar11,0,*(undefined8 *)(param_5 + 8));
  return __return_storage_ptr__;
}

Assistant:

std::vector<typename std::iterator_traits<_Iterator>::value_type>
sample_block_decomp(_Iterator begin, _Iterator end, _Compare comp, int s, const mxx::comm& comm, MPI_Datatype mpi_dt)
{
    typedef typename std::iterator_traits<_Iterator>::value_type value_type;
    std::size_t local_size = std::distance(begin, end);
    MXX_ASSERT(local_size > 0);
    int p = comm.size();

    // 1. samples
    //  - pick `s` samples equally spaced such that `s` samples define `s+1`
    //    subsequences in the sorted order
    std::vector<value_type> local_splitters(s);
    _Iterator pos = begin;
    for (std::size_t i = 0; i < local_splitters.size(); ++i) {
        std::size_t bucket_size = local_size / (s+1) + (i < (local_size % (s+1)) ? 1 : 0);
        // pick last element of each bucket
        pos += (bucket_size-1);
        local_splitters[i] = *pos;
        ++pos;
    }

    // 2. gather samples to `rank = 0`
    // - TODO: rather call sample sort
    //         recursively and implement a base case for samplesort which does
    //         gather to rank=0, local sort and redistribute
    if (comm.rank() == 0) {
        std::vector<value_type> all_samples(p*s);
        MPI_Gather(&local_splitters[0], s, mpi_dt,
                   &all_samples[0], s, mpi_dt, 0, comm);

        // 3. local sort on master
        std::sort(all_samples.begin(), all_samples.end(), comp);

        // 4. pick p-1 splitters and broadcast them
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
        // split into `p` pieces and choose the `p-1` splitting elements
        _Iterator pos = all_samples.begin();
        for (std::size_t i = 0; i < local_splitters.size(); ++i)
        {
            std::size_t bucket_size = (p*s) / p + (i < static_cast<std::size_t>((p*s) % p) ? 1 : 0);
            // pick last element of each bucket
            local_splitters[i] = *(pos + (bucket_size-1));
            pos += bucket_size;
        }
    }
    else
    {
        // simply send
        MPI_Gather(&local_splitters[0], s, mpi_dt, NULL, 0, mpi_dt, 0, comm);

        // resize splitters for receiving
        if (local_splitters.size() != (size_t) p-1) {
            local_splitters.resize(p-1);
        }
    }

    // 4. broadcast and receive final splitters
    MPI_Bcast(&local_splitters[0], local_splitters.size(), mpi_dt, 0, comm);

    return local_splitters;
}